

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O0

void __thiscall
TPZSparseBlockDiagonal<double>::MultAdd
          (TPZSparseBlockDiagonal<double> *this,TPZFMatrix<double> *x,TPZFMatrix<double> *y,
          TPZFMatrix<double> *z,double alpha,double beta,int opt)

{
  TPZFMatrix<double> *out;
  TPZBaseMatrix *in_RCX;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  int __x;
  TPZFMatrix<double> *in_RDI;
  TPZBaseMatrix *pTVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  TPZFNMatrix<1000,_double> zsc;
  TPZFNMatrix<1000,_double> ysc;
  TPZFNMatrix<1000,_double> xsc;
  int64_t in_stack_ffffffffffff9ff0;
  int64_t in_stack_ffffffffffff9ff8;
  TPZFNMatrix<1000,_double> *in_stack_ffffffffffffa000;
  double *in_stack_ffffffffffffa008;
  int64_t in_stack_ffffffffffffa010;
  TPZFNMatrix<1000,_double> *this_00;
  int64_t in_stack_ffffffffffffa048;
  int64_t in_stack_ffffffffffffa050;
  TPZFMatrix<double> *in_stack_ffffffffffffa058;
  int in_stack_ffffffffffffa084;
  double in_stack_ffffffffffffa088;
  double in_stack_ffffffffffffa090;
  TPZFMatrix<double> *in_stack_ffffffffffffa098;
  TPZFMatrix<double> *in_stack_ffffffffffffa0a0;
  TPZFMatrix<double> *in_stack_ffffffffffffa0a8;
  TPZBlockDiagonal<double> *in_stack_ffffffffffffa0b0;
  
  this_00 = (TPZFNMatrix<1000,_double> *)0x0;
  TPZFNMatrix<1000,_double>::TPZFNMatrix
            (in_stack_ffffffffffffa000,in_stack_ffffffffffff9ff8,in_stack_ffffffffffff9ff0);
  TPZFNMatrix<1000,_double>::TPZFNMatrix
            (this_00,(int64_t)in_RDI,in_stack_ffffffffffffa010,in_stack_ffffffffffffa008);
  TPZFNMatrix<1000,_double>::TPZFNMatrix
            (in_stack_ffffffffffffa000,in_stack_ffffffffffff9ff8,in_stack_ffffffffffff9ff0);
  out = (TPZFMatrix<double> *)TPZVec<long>::NElements((TPZVec<long> *)&(in_RDI->fWork).fNElements);
  TPZBaseMatrix::Cols(in_RSI);
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffffa058,in_stack_ffffffffffffa050,in_stack_ffffffffffffa048);
  pTVar1 = in_RCX;
  (*(in_RCX->super_TPZSavable)._vptr_TPZSavable[0xf])();
  std::abs((int)pTVar1);
  if ((extraout_XMM0_Qa != 0.0) || (NAN(extraout_XMM0_Qa))) {
    TPZVec<long>::NElements((TPZVec<long> *)&(in_RDI->fWork).fNElements);
    TPZBaseMatrix::Cols(in_RDX);
    TPZFMatrix<double>::Resize
              (in_stack_ffffffffffffa058,in_stack_ffffffffffffa050,in_stack_ffffffffffffa048);
  }
  TPZVec<long>::NElements((TPZVec<long> *)&(in_RDI->fWork).fNElements);
  TPZBaseMatrix::Cols(in_RCX);
  TPZFMatrix<double>::Resize
            (in_stack_ffffffffffffa058,in_stack_ffffffffffffa050,in_stack_ffffffffffffa048);
  __x = (int)in_RDI;
  Gather((TPZSparseBlockDiagonal<double> *)this_00,in_RDI,out);
  std::abs(__x);
  if ((extraout_XMM0_Qa_00 != 0.0) || (NAN(extraout_XMM0_Qa_00))) {
    Scatter((TPZSparseBlockDiagonal<double> *)this_00,in_RDI,out);
  }
  TPZBlockDiagonal<double>::MultAdd
            (in_stack_ffffffffffffa0b0,in_stack_ffffffffffffa0a8,in_stack_ffffffffffffa0a0,
             in_stack_ffffffffffffa098,in_stack_ffffffffffffa090,in_stack_ffffffffffffa088,
             in_stack_ffffffffffffa084);
  Scatter((TPZSparseBlockDiagonal<double> *)this_00,in_RDI,out);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x13aa2fd);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x13aa30a);
  TPZFNMatrix<1000,_double>::~TPZFNMatrix((TPZFNMatrix<1000,_double> *)0x13aa317);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::MultAdd(const TPZFMatrix<TVar>& x, const TPZFMatrix<TVar>& y, TPZFMatrix<TVar>& z, const TVar alpha, const TVar beta, const int opt) const
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::MultAdd");
#endif
	TPZFNMatrix<1000,TVar> xsc(0,0),ysc(0,0,0.),zsc(0,0);
	xsc.Resize(this->fBlock.NElements(),x.Cols());
	z.Zero();
	if(abs(beta) != 0.) ysc.Resize(fBlock.NElements(),y.Cols());
	zsc.Resize(fBlock.NElements(),z.Cols());
	Gather(x,xsc);
	if(abs(beta) != 0.) Scatter(y,ysc);
	TPZBlockDiagonal<TVar>::MultAdd(xsc, ysc, zsc, alpha, beta, opt);
	Scatter(zsc,z);
}